

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::prepare_int_buffer<fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,uint num_digits,FormatSpec *spec,char *prefix,uint prefix_size
          )

{
  uint uVar1;
  wchar_t wVar2;
  Alignment AVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  CharPtr pwVar8;
  int *piVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  int *piVar18;
  ulong uVar19;
  wchar_t __tmp;
  uint uVar20;
  size_t size;
  int iVar29;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  undefined1 auVar36 [16];
  AlignSpec subspec;
  AlignSpec local_4c;
  long local_40;
  ulong local_38;
  
  uVar11 = (ulong)num_digits;
  uVar1 = (spec->super_AlignSpec).super_WidthSpec.width_;
  uVar19 = (ulong)uVar1;
  wVar2 = (spec->super_AlignSpec).super_WidthSpec.fill_;
  AVar3 = (spec->super_AlignSpec).align_;
  if ((int)num_digits < spec->precision_) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    uVar13 = spec->precision_ + prefix_size;
    local_4c.super_WidthSpec.fill_ = L'0';
    local_4c.align_ = ALIGN_NUMERIC;
    local_4c.super_WidthSpec.width_ = uVar13;
    if (uVar1 <= uVar13) {
      pwVar8 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_4c,prefix,prefix_size);
      return pwVar8;
    }
    puVar4 = *(undefined8 **)(this + 8);
    if ((ulong)puVar4[3] < uVar19) {
      (**(code **)*puVar4)(puVar4,uVar19);
    }
    uVar20 = uVar1 - uVar13;
    if (AVar3 != ALIGN_LEFT) {
      puVar4 = *(undefined8 **)(this + 8);
      lVar16 = puVar4[2];
      uVar19 = lVar16 + (ulong)uVar20;
      if ((ulong)puVar4[3] < uVar19) {
        local_40 = lVar16;
        local_38 = uVar11;
        (**(code **)*puVar4)(puVar4,uVar19);
        num_digits = (uint)local_38;
        lVar16 = local_40;
      }
      puVar4[2] = uVar19;
      auVar7 = _DAT_001adfa0;
      auVar6 = _DAT_001aa220;
      auVar5 = _DAT_001aa210;
      if (uVar1 != uVar13) {
        uVar19 = (ulong)uVar20 + 0x3fffffffffffffff;
        uVar11 = uVar19 & 0x3fffffffffffffff;
        auVar23._8_4_ = (int)uVar11;
        auVar23._0_8_ = uVar11;
        auVar23._12_4_ = (int)(uVar11 >> 0x20);
        lVar16 = *(long *)(*(long *)(this + 8) + 8) + lVar16 * 4;
        lVar12 = 0;
        auVar23 = auVar23 ^ _DAT_001aa220;
        do {
          auVar31._8_4_ = (int)lVar12;
          auVar31._0_8_ = lVar12;
          auVar31._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar36 = (auVar31 | auVar5) ^ auVar6;
          iVar29 = auVar23._4_4_;
          if ((bool)(~(auVar36._4_4_ == iVar29 && auVar23._0_4_ < auVar36._0_4_ ||
                      iVar29 < auVar36._4_4_) & 1)) {
            *(wchar_t *)(lVar16 + lVar12 * 4) = wVar2;
          }
          if ((auVar36._12_4_ != auVar23._12_4_ || auVar36._8_4_ <= auVar23._8_4_) &&
              auVar36._12_4_ <= auVar23._12_4_) {
            *(wchar_t *)(lVar16 + 4 + lVar12 * 4) = wVar2;
          }
          auVar31 = (auVar31 | auVar7) ^ auVar6;
          iVar37 = auVar31._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar31._0_4_ <= auVar23._0_4_)) {
            *(wchar_t *)(lVar16 + 8 + lVar12 * 4) = wVar2;
            *(wchar_t *)(lVar16 + 0xc + lVar12 * 4) = wVar2;
          }
          lVar12 = lVar12 + 4;
        } while ((uVar11 - ((uint)uVar19 & 3)) + 4 != lVar12);
      }
    }
    pwVar8 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_4c,prefix,prefix_size);
    if (AVar3 != ALIGN_LEFT) {
      return pwVar8;
    }
    puVar4 = *(undefined8 **)(this + 8);
    lVar16 = puVar4[2];
    uVar11 = lVar16 + (ulong)uVar20;
    if ((ulong)puVar4[3] < uVar11) {
      (**(code **)*puVar4)(puVar4,uVar11);
    }
    puVar4[2] = uVar11;
    auVar7 = _DAT_001adfa0;
    auVar6 = _DAT_001aa220;
    auVar5 = _DAT_001aa210;
    if (uVar1 == uVar13) {
      return pwVar8;
    }
    uVar19 = (ulong)uVar20 + 0x3fffffffffffffff;
    uVar11 = uVar19 & 0x3fffffffffffffff;
    auVar36._8_4_ = (int)uVar11;
    auVar36._0_8_ = uVar11;
    auVar36._12_4_ = (int)(uVar11 >> 0x20);
    lVar16 = *(long *)(*(long *)(this + 8) + 8) + lVar16 * 4;
    lVar12 = 0;
    auVar36 = auVar36 ^ _DAT_001aa220;
    do {
      auVar32._8_4_ = (int)lVar12;
      auVar32._0_8_ = lVar12;
      auVar32._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar23 = (auVar32 | auVar5) ^ auVar6;
      iVar29 = auVar36._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar29 && auVar36._0_4_ < auVar23._0_4_ ||
                  iVar29 < auVar23._4_4_) & 1)) {
        *(wchar_t *)(lVar16 + lVar12 * 4) = wVar2;
      }
      if ((auVar23._12_4_ != auVar36._12_4_ || auVar23._8_4_ <= auVar36._8_4_) &&
          auVar23._12_4_ <= auVar36._12_4_) {
        *(wchar_t *)(lVar16 + 4 + lVar12 * 4) = wVar2;
      }
      auVar23 = (auVar32 | auVar7) ^ auVar6;
      iVar37 = auVar23._4_4_;
      if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar36._0_4_)) {
        *(wchar_t *)(lVar16 + 8 + lVar12 * 4) = wVar2;
        *(wchar_t *)(lVar16 + 0xc + lVar12 * 4) = wVar2;
      }
      lVar12 = lVar12 + 4;
    } while ((uVar11 - ((uint)uVar19 & 3)) + 4 != lVar12);
    return pwVar8;
  }
  uVar13 = prefix_size + num_digits;
  puVar4 = *(undefined8 **)(this + 8);
  lVar16 = puVar4[2];
  if (uVar1 <= uVar13) {
    uVar11 = lVar16 + (ulong)uVar13;
    if ((ulong)puVar4[3] < uVar11) {
      (**(code **)*puVar4)(puVar4,uVar11);
    }
    puVar4[2] = uVar11;
    lVar16 = lVar16 * 4 + *(long *)(*(long *)(this + 8) + 8);
    if (prefix_size != 0) {
      lVar12 = (ulong)prefix_size + 1;
      lVar10 = 0;
      do {
        *(int *)(lVar16 + lVar10 * 4) = (int)prefix[lVar10];
        lVar12 = lVar12 + -1;
        lVar10 = lVar10 + 1;
      } while (1 < lVar12);
    }
    piVar9 = (int *)(lVar16 + (ulong)uVar13 * 4);
    goto LAB_0019aacf;
  }
  uVar15 = lVar16 + uVar19;
  if ((ulong)puVar4[3] < uVar15) {
    (**(code **)*puVar4)(puVar4);
  }
  puVar4[2] = uVar15;
  auVar7 = _DAT_001adfa0;
  auVar6 = _DAT_001aa220;
  auVar5 = _DAT_001aa210;
  lVar12 = *(long *)(*(long *)(this + 8) + 8);
  piVar18 = (int *)(lVar12 + lVar16 * 4);
  piVar9 = piVar18 + uVar19;
  if (AVar3 == ALIGN_NUMERIC) {
    if (prefix_size == 0) goto LAB_0019a9b4;
    lVar16 = (ulong)prefix_size + 1;
    do {
      *piVar18 = (int)*prefix;
      prefix = prefix + 1;
      piVar18 = piVar18 + 1;
      lVar16 = lVar16 + -1;
    } while (1 < lVar16);
  }
  else {
    if (AVar3 == ALIGN_CENTER) {
      uVar11 = (ulong)uVar13;
      uVar15 = uVar19 - uVar11 >> 1;
      if (1 < uVar19 - uVar11) {
        uVar17 = uVar15 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar17;
        auVar24._0_8_ = uVar17;
        auVar24._12_4_ = (int)(uVar17 >> 0x20);
        lVar10 = lVar12 + lVar16 * 4;
        lVar14 = 0;
        auVar24 = auVar24 ^ _DAT_001aa220;
        do {
          auVar33._8_4_ = (int)lVar14;
          auVar33._0_8_ = lVar14;
          auVar33._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auVar23 = (auVar33 | auVar5) ^ auVar6;
          iVar29 = auVar24._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar29 && auVar24._0_4_ < auVar23._0_4_ ||
                      iVar29 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar10 + lVar14 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar24._12_4_ || auVar23._8_4_ <= auVar24._8_4_) &&
              auVar23._12_4_ <= auVar24._12_4_) {
            *(wchar_t *)(lVar10 + 4 + lVar14 * 4) = wVar2;
          }
          auVar23 = (auVar33 | auVar7) ^ auVar6;
          iVar37 = auVar23._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar24._0_4_)) {
            *(wchar_t *)(lVar10 + 8 + lVar14 * 4) = wVar2;
            *(wchar_t *)(lVar10 + 0xc + lVar14 * 4) = wVar2;
          }
          lVar14 = lVar14 + 4;
        } while ((uVar17 - ((uint)(uVar15 + 0x3fffffffffffffff) & 3)) + 4 != lVar14);
      }
      auVar7 = _DAT_001adfa0;
      auVar6 = _DAT_001aa220;
      auVar5 = _DAT_001aa210;
      if (uVar1 != uVar13) {
        uVar17 = (uVar19 * 4 + (uVar15 + uVar11) * -4) - 4;
        auVar25._8_4_ = (int)uVar17;
        auVar25._0_8_ = uVar17;
        auVar25._12_4_ = (int)(uVar17 >> 0x20);
        auVar26._0_8_ = uVar17 >> 2;
        auVar26._8_8_ = auVar25._8_8_ >> 2;
        lVar12 = lVar12 + uVar15 * 4 + lVar16 * 4 + uVar11 * 4;
        uVar19 = 0;
        auVar26 = auVar26 ^ _DAT_001aa220;
        do {
          auVar34._8_4_ = (int)uVar19;
          auVar34._0_8_ = uVar19;
          auVar34._12_4_ = (int)(uVar19 >> 0x20);
          auVar23 = (auVar34 | auVar5) ^ auVar6;
          iVar29 = auVar26._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar29 && auVar26._0_4_ < auVar23._0_4_ ||
                      iVar29 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar12 + uVar19 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar26._12_4_ || auVar23._8_4_ <= auVar26._8_4_) &&
              auVar23._12_4_ <= auVar26._12_4_) {
            *(wchar_t *)(lVar12 + 4 + uVar19 * 4) = wVar2;
          }
          auVar23 = (auVar34 | auVar7) ^ auVar6;
          iVar37 = auVar23._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar26._0_4_)) {
            *(wchar_t *)(lVar12 + 8 + uVar19 * 4) = wVar2;
            *(wchar_t *)(lVar12 + 0xc + uVar19 * 4) = wVar2;
          }
          uVar19 = uVar19 + 4;
        } while (((uVar17 >> 2) + 4 & 0xfffffffffffffffc) != uVar19);
      }
      if (prefix_size != 0) {
        lVar16 = (ulong)prefix_size + 1;
        lVar12 = 0;
        do {
          piVar18[uVar15 + lVar12] = (int)prefix[lVar12];
          lVar16 = lVar16 + -1;
          lVar12 = lVar12 + 1;
        } while (1 < lVar16);
      }
      piVar9 = piVar18 + uVar15 + uVar11;
      goto LAB_0019aacf;
    }
    if (AVar3 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        lVar10 = (ulong)prefix_size + 1;
        lVar14 = 0;
        do {
          piVar18[lVar14] = (int)prefix[lVar14];
          lVar10 = lVar10 + -1;
          lVar14 = lVar14 + 1;
        } while (1 < lVar10);
      }
      auVar7 = _DAT_001adfa0;
      auVar6 = _DAT_001aa220;
      auVar5 = _DAT_001aa210;
      uVar11 = (ulong)uVar13;
      piVar9 = piVar18 + uVar11;
      if (uVar13 != uVar1) {
        uVar19 = (uVar19 * 4 + uVar11 * -4) - 4;
        auVar21._8_4_ = (int)uVar19;
        auVar21._0_8_ = uVar19;
        auVar21._12_4_ = (int)(uVar19 >> 0x20);
        auVar22._0_8_ = uVar19 >> 2;
        auVar22._8_8_ = auVar21._8_8_ >> 2;
        lVar12 = lVar12 + uVar11 * 4 + lVar16 * 4;
        uVar11 = 0;
        auVar22 = auVar22 ^ _DAT_001aa220;
        do {
          auVar30._8_4_ = (int)uVar11;
          auVar30._0_8_ = uVar11;
          auVar30._12_4_ = (int)(uVar11 >> 0x20);
          auVar23 = (auVar30 | auVar5) ^ auVar6;
          iVar29 = auVar22._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar29 && auVar22._0_4_ < auVar23._0_4_ ||
                      iVar29 < auVar23._4_4_) & 1)) {
            *(wchar_t *)(lVar12 + uVar11 * 4) = wVar2;
          }
          if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
              auVar23._12_4_ <= auVar22._12_4_) {
            *(wchar_t *)(lVar12 + 4 + uVar11 * 4) = wVar2;
          }
          auVar23 = (auVar30 | auVar7) ^ auVar6;
          iVar37 = auVar23._4_4_;
          if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar22._0_4_)) {
            *(wchar_t *)(lVar12 + 8 + uVar11 * 4) = wVar2;
            *(wchar_t *)(lVar12 + 0xc + uVar11 * 4) = wVar2;
          }
          uVar11 = uVar11 + 4;
        } while (((uVar19 >> 2) + 4 & 0xfffffffffffffffc) != uVar11);
      }
      goto LAB_0019aacf;
    }
    if (prefix_size != 0) {
      lVar10 = (ulong)prefix_size + 1;
      lVar16 = 0;
      do {
        piVar9[lVar16 - (ulong)uVar13] = (int)prefix[lVar16];
        lVar10 = lVar10 + -1;
        lVar16 = lVar16 + 1;
      } while (1 < lVar10);
    }
LAB_0019a9b4:
    uVar11 = (ulong)uVar13;
  }
  auVar7 = _DAT_001adfa0;
  auVar6 = _DAT_001aa220;
  auVar5 = _DAT_001aa210;
  if (piVar18 != piVar9 + -uVar11) {
    uVar11 = ((lVar12 + uVar15 * 4) - (long)(piVar18 + uVar11)) - 4;
    auVar27._8_4_ = (int)uVar11;
    auVar27._0_8_ = uVar11;
    auVar27._12_4_ = (int)(uVar11 >> 0x20);
    auVar28._0_8_ = uVar11 >> 2;
    auVar28._8_8_ = auVar27._8_8_ >> 2;
    uVar19 = 0;
    auVar28 = auVar28 ^ _DAT_001aa220;
    do {
      auVar35._8_4_ = (int)uVar19;
      auVar35._0_8_ = uVar19;
      auVar35._12_4_ = (int)(uVar19 >> 0x20);
      auVar23 = (auVar35 | auVar5) ^ auVar6;
      iVar29 = auVar28._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar29 && auVar28._0_4_ < auVar23._0_4_ ||
                  iVar29 < auVar23._4_4_) & 1)) {
        piVar18[uVar19] = wVar2;
      }
      if ((auVar23._12_4_ != auVar28._12_4_ || auVar23._8_4_ <= auVar28._8_4_) &&
          auVar23._12_4_ <= auVar28._12_4_) {
        piVar18[uVar19 + 1] = wVar2;
      }
      auVar23 = (auVar35 | auVar7) ^ auVar6;
      iVar37 = auVar23._4_4_;
      if (iVar37 <= iVar29 && (iVar37 != iVar29 || auVar23._0_4_ <= auVar28._0_4_)) {
        piVar18[uVar19 + 2] = wVar2;
        piVar18[uVar19 + 3] = wVar2;
      }
      uVar19 = uVar19 + 4;
    } while (((uVar11 >> 2) + 4 & 0xfffffffffffffffc) != uVar19);
  }
LAB_0019aacf:
  return piVar9 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr
  BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec,
    const char *prefix, unsigned prefix_size) {
  unsigned width = spec.width();
  Alignment align = spec.align();
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  if (spec.precision() > static_cast<int>(num_digits)) {
    // Octal prefix '0' is counted as a digit, so ignore it if precision
    // is specified.
    if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
      --prefix_size;
    unsigned number_size =
        prefix_size + internal::to_unsigned(spec.precision());
    AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
    if (number_size >= width)
      return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
    buffer_.reserve(width);
    unsigned fill_size = width - number_size;
    if (align != ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    CharPtr result = prepare_int_buffer(
        num_digits, subspec, prefix, prefix_size);
    if (align == ALIGN_LEFT) {
      CharPtr p = grow_buffer(fill_size);
      std::uninitialized_fill(p, p + fill_size, fill);
    }
    return result;
  }
  unsigned size = prefix_size + num_digits;
  if (width <= size) {
    CharPtr p = grow_buffer(size);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    return p + size - 1;
  }
  CharPtr p = grow_buffer(width);
  CharPtr end = p + width;
  if (align == ALIGN_LEFT) {
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
    std::uninitialized_fill(p, end, fill);
  } else if (align == ALIGN_CENTER) {
    p = fill_padding(p, width, size, fill);
    std::uninitialized_copy(prefix, prefix + prefix_size, p);
    p += size;
  } else {
    if (align == ALIGN_NUMERIC) {
      if (prefix_size != 0) {
        p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
        size -= prefix_size;
      }
    } else {
      std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
    }
    std::uninitialized_fill(p, end - size, fill);
    p = end;
  }
  return p - 1;
}